

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

int * Abc_FrameMiniAigReadCoArrivals(Abc_Frame_t *pAbc)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *pGVar2;
  void *__dest;
  int *piVar3;
  size_t __size;
  char *__s;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    __s = "ABC framework is not initialized by calling Abc_Start()";
  }
  else {
    pGVar2 = Abc_FrameReadGia(pAbc);
    if (pGVar2 == (Gia_Man_t *)0x0) {
      __s = "Current network in ABC framework is not defined.";
    }
    else {
      pVVar1 = pGVar2->vCoArrs;
      if (pVVar1 != (Vec_Int_t *)0x0) {
        if ((long)pVVar1->nSize == 0) {
          __size = 0;
          __dest = (void *)0x0;
        }
        else {
          __size = (long)pVVar1->nSize << 2;
          __dest = malloc(__size);
        }
        piVar3 = (int *)memcpy(__dest,pVVar1->pArray,__size);
        return piVar3;
      }
      __s = "Current network in ABC framework has no CO arrival times.";
    }
  }
  puts(__s);
  return (int *)0x0;
}

Assistant:

int * Abc_FrameMiniAigReadCoArrivals( Abc_Frame_t * pAbc )
{
    Vec_Int_t * vArrs; int * pArrs;
    Gia_Man_t * pGia;
    if ( pAbc == NULL )
        { printf( "ABC framework is not initialized by calling Abc_Start()\n" ); return NULL; }
    pGia = Abc_FrameReadGia( pAbc );
    if ( pGia == NULL )
        { printf( "Current network in ABC framework is not defined.\n" ); return NULL; }
    if ( pGia->vCoArrs == NULL )
        { printf( "Current network in ABC framework has no CO arrival times.\n" ); return NULL; }
    vArrs = Vec_IntDup( pGia->vCoArrs );
    pArrs = Vec_IntReleaseArray( vArrs );
    Vec_IntFree( vArrs );
    return pArrs;
}